

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

bool __thiscall Clasp::MinimizeBuilder::CmpWeight::operator()(CmpWeight *this,MLit *lhs,MLit *rhs)

{
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  LevelWeight *wRhs;
  LevelWeight *wLhs;
  bool local_3a;
  bool local_39;
  const_reference local_30;
  const_reference local_28;
  bool local_1;
  
  if (*in_RDI == 0) {
    local_1 = *(int *)(in_RDX + 8) < *(int *)(in_RSI + 8);
  }
  else {
    local_28 = bk_lib::
               pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
               ::operator[]((pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                             *)*in_RDI,*(size_type *)(in_RSI + 8));
    local_30 = bk_lib::
               pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
               ::operator[]((pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                             *)*in_RDI,*(size_type *)(in_RDX + 8));
    for (; (*(uint *)local_28 & 0x7fffffff) == (*(uint *)local_30 & 0x7fffffff);
        local_28 = local_28 + 1) {
      if (local_28->weight != local_30->weight) {
        return local_30->weight < local_28->weight;
      }
      if (-1 < (int)*(uint *)local_28) {
        local_3a = false;
        if ((int)*(uint *)local_30 < 0) {
          local_3a = local_30[1].weight < 0;
        }
        return local_3a;
      }
      if (-1 < (int)*(uint *)local_30) {
        return 0 < local_28[1].weight;
      }
      local_30 = local_30 + 1;
    }
    if ((*(uint *)local_28 & 0x7fffffff) < (*(uint *)local_30 & 0x7fffffff)) {
      local_39 = 0 < local_28->weight;
    }
    else {
      local_39 = local_30->weight < 0;
    }
    local_1 = local_39;
  }
  return local_1;
}

Assistant:

bool MinimizeBuilder::CmpWeight::operator()(const MLit& lhs, const MLit& rhs) const {
	if (!weights) { return lhs.weight > rhs.weight; }
	const SharedData::LevelWeight* wLhs = &(*weights)[lhs.weight];
	const SharedData::LevelWeight* wRhs = &(*weights)[rhs.weight];
	for (;; ++wLhs, ++wRhs) {
		if (wLhs->level != wRhs->level)  {
			return wLhs->level < wRhs->level ? wLhs->weight > 0 : 0 > wRhs->weight;
		}
		if (wLhs->weight != wRhs->weight){ return wLhs->weight > wRhs->weight; }
		if (!wLhs->next) { return wRhs->next && (++wRhs)->weight < 0; }
		if (!wRhs->next) { ++wLhs; break; }
	}
	return wLhs->weight > 0;
}